

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type_examples.cpp
# Opt level: O2

void density_tests::feature_list_examples(void)

{
  return;
}

Assistant:

void feature_list_examples()
    {
        using namespace density;

        {
        //! [feature_list example 1]
    using FewFeatures = feature_list<f_size, f_alignment>;
    using MoreFeatures = feature_list<FewFeatures, f_default_construct, f_copy_construct, f_move_construct, f_destroy>;
    using ManyFeatures = feature_list<MoreFeatures, f_equal, f_less, f_hash>;
        //! [feature_list example 1]

        //! [feature_list example 2]
    static_assert(std::is_same<
        FewFeatures::tuple_type, 
        std::tuple<f_size, f_alignment>>::value, "");
        //! [feature_list example 2]

        //! [feature_list example 3]
    static_assert(std::is_same<
        ManyFeatures::tuple_type, std::tuple<
            f_size, f_alignment,
            f_default_construct, f_copy_construct, f_move_construct, f_destroy,
            f_equal, f_less, f_hash
        >>::value, "");
        //! [feature_list example 3]
        }
        {
        //! [feature_list example 4]
    // Features1, Features2 and Features3 are equivalent....
    using Features1 = feature_list<f_size, f_alignment, f_copy_construct>;
    using Features2 = feature_list< feature_list<f_size>, 
        feature_list<f_alignment, f_copy_construct>>;
    using Features3 = feature_list<
        feature_list<f_size, f_none>, feature_list<feature_list<f_none>>,
        feature_list<f_size, f_alignment, f_copy_construct, f_none, f_copy_construct, f_size>>;
        
    // ...because they produce the same tuple
    static_assert(std::is_same<Features1::tuple_type, Features2::tuple_type>::value, "");
    static_assert(std::is_same<Features2::tuple_type, Features3::tuple_type>::value, "");
        //! [feature_list example 4]
        //! [feature_list example 5]
    using MyFeatures    = feature_list<f_size, f_alignment, f_copy_construct>;
    using MyRuntimeType = runtime_type<MyFeatures>;

    // this is ok: int supports sizeof, alignof, and copy construction
    auto IntType = MyRuntimeType::make<int>();

    // this fails to compile: std::mutex doesn't allow copy construction
    // auto MutexType = MyRuntimeType::make<std::mutex>();

    // MyFeatures::tuple<void> = std::tuple<f_size::type<void>, f_alignment::type<void>, f_copy_construct::type<void>>
    static_assert(
        std::is_same<MyFeatures::tuple_type, std::tuple<f_size, f_alignment, f_copy_construct>>::
        value,
        "");
        //! [feature_list example 5]
        }
        {
        //! [has_features example 1]
    using MyFeatures = feature_list<f_size, f_alignment>;
    static_assert(has_features<MyFeatures>::value, "");
    static_assert(has_features<MyFeatures, f_size>::value, "");
    static_assert(has_features<MyFeatures, f_alignment>::value, "");
    static_assert(has_features<MyFeatures, f_size, f_alignment>::value, "");
    static_assert(!has_features<MyFeatures, f_copy_construct>::value, "");
    static_assert(!has_features<MyFeatures, f_size, f_copy_construct>::value, "");
    static_assert(!has_features<MyFeatures, f_copy_construct, f_size>::value, "");
        //! [has_features example 1]
        }
        {
        //! [has_features example 2]
    using type = runtime_type<f_size, f_alignment>;
    static_assert(has_features<type>::value, "");
    static_assert(has_features<type, f_size>::value, "");
    static_assert(has_features<type, f_alignment>::value, "");
    static_assert(has_features<type, f_size, f_alignment>::value, "");
    static_assert(!has_features<type, f_copy_construct>::value, "");
    static_assert(!has_features<type, f_size, f_copy_construct>::value, "");
    static_assert(!has_features<type, f_copy_construct, f_size>::value, "");
        //! [has_features example 2]
        }
    

        {
            std::aligned_storage<sizeof(std::string), alignof(std::string)>::type storage;
            void * storage_ptr = &storage;

            //! [f_default_construct example 1]
            auto const string_contruct = f_default_construct::make<std::string>();

            string_contruct(storage_ptr);
            //! [f_default_construct example 1]

            //! [f_destroy example 1]
            auto const string_destroy = f_default_construct::make<std::string>();

            string_destroy(storage_ptr);
            //! [f_destroy example 1]
        }
    }